

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O0

bool __thiscall CFileCollection::IsFilenameValid(CFileCollection *this,char *pFilename)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  char *in_RDI;
  char *in_stack_ffffffffffffffd8;
  
  iVar1 = str_length((char *)0x23baf6);
  if (((iVar1 != *(int *)(in_RDI + 0x1fc8) + 0x14 + *(int *)(in_RDI + 0x1fec)) ||
      (iVar1 = str_comp_num(in_RDI,in_stack_ffffffffffffffd8,0), iVar1 != 0)) ||
     (iVar1 = str_comp(in_RDI,in_stack_ffffffffffffffd8), iVar1 != 0)) {
    return false;
  }
  pcVar2 = (char *)(in_RSI + *(int *)(in_RDI + 0x1fc8));
  if ((((((*pcVar2 == '_') && ('/' < pcVar2[1])) &&
        ((pcVar2[1] < ':' && (('/' < pcVar2[2] && (pcVar2[2] < ':')))))) && ('/' < pcVar2[3])) &&
      (((((((((pcVar2[3] < ':' && ('/' < pcVar2[4])) && (pcVar2[4] < ':')) &&
            ((pcVar2[5] == '-' && ('/' < pcVar2[6])))) && (pcVar2[6] < ':')) &&
          (('/' < pcVar2[7] && (pcVar2[7] < ':')))) &&
         ((pcVar2[8] == '-' && ((('/' < pcVar2[9] && (pcVar2[9] < ':')) && ('/' < pcVar2[10]))))))
        && ((((pcVar2[10] < ':' && (pcVar2[0xb] == '_')) && ('/' < pcVar2[0xc])) &&
            (((pcVar2[0xc] < ':' && ('/' < pcVar2[0xd])) &&
             ((pcVar2[0xd] < ':' &&
              (((pcVar2[0xe] == '-' && ('/' < pcVar2[0xf])) && (pcVar2[0xf] < ':')))))))))) &&
       (('/' < pcVar2[0x10] && (pcVar2[0x10] < ':')))))) &&
     ((pcVar2[0x11] == '-' &&
      ((('/' < pcVar2[0x12] && (pcVar2[0x12] < ':')) &&
       (('/' < pcVar2[0x13] && (pcVar2[0x13] < ':')))))))) {
    return true;
  }
  return false;
}

Assistant:

bool CFileCollection::IsFilenameValid(const char *pFilename)
{
	if(str_length(pFilename) != m_FileDescLength+TIMESTAMP_LENGTH+m_FileExtLength ||
		str_comp_num(pFilename, m_aFileDesc, m_FileDescLength) ||
		str_comp(pFilename+m_FileDescLength+TIMESTAMP_LENGTH, m_aFileExt))
		return false;

	pFilename += m_FileDescLength;
	if(pFilename[0] == '_' &&
		pFilename[1] >= '0' && pFilename[1] <= '9' &&
		pFilename[2] >= '0' && pFilename[2] <= '9' &&
		pFilename[3] >= '0' && pFilename[3] <= '9' &&
		pFilename[4] >= '0' && pFilename[4] <= '9' &&
		pFilename[5] == '-' &&
		pFilename[6] >= '0' && pFilename[6] <= '9' &&
		pFilename[7] >= '0' && pFilename[7] <= '9' &&
		pFilename[8] == '-' &&
		pFilename[9] >= '0' && pFilename[9] <= '9' &&
		pFilename[10] >= '0' && pFilename[10] <= '9' &&
		pFilename[11] == '_' &&
		pFilename[12] >= '0' && pFilename[12] <= '9' &&
		pFilename[13] >= '0' && pFilename[13] <= '9' &&
		pFilename[14] == '-' &&
		pFilename[15] >= '0' && pFilename[15] <= '9' &&
		pFilename[16] >= '0' && pFilename[16] <= '9' &&
		pFilename[17] == '-' &&
		pFilename[18] >= '0' && pFilename[18] <= '9' &&
		pFilename[19] >= '0' && pFilename[19] <= '9')
		return true;

	return false;
}